

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::LowerProfiledLdElemI(Lowerer *this,JitProfilingInstr *instr)

{
  Func *func_00;
  code *pcVar1;
  bool bVar2;
  int32 iVar3;
  undefined4 *puVar4;
  IntConstOpnd *pIVar5;
  AddrOpnd *opndArg;
  Opnd *this_00;
  IndirOpnd *this_01;
  Var address;
  RegOpnd *opndArg_00;
  HelperCallOpnd *newSrc;
  AddrOpnd *local_90;
  Opnd *indexOpnd;
  IndirOpnd *indir;
  Func *func;
  JitProfilingInstr *instr_local;
  Lowerer *this_local;
  
  if (instr == (JitProfilingInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2337,"(instr)","instr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  func_00 = (instr->super_Instr).m_func;
  pIVar5 = IR::IntConstOpnd::New(0,TyInt8,func_00,false);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,&instr->super_Instr,&pIVar5->super_Opnd);
  pIVar5 = IR::IntConstOpnd::New(0,TyInt8,func_00,false);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,&instr->super_Instr,&pIVar5->super_Opnd);
  pIVar5 = IR::Opnd::CreateProfileIdOpnd(instr->profileId,func_00);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,&instr->super_Instr,&pIVar5->super_Opnd);
  opndArg = CreateFunctionBodyOpnd(this,func_00);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,&instr->super_Instr,&opndArg->super_Opnd);
  this_00 = IR::Instr::UnlinkSrc1(&instr->super_Instr);
  this_01 = IR::Opnd::AsIndirOpnd(this_00);
  local_90 = (AddrOpnd *)IR::IndirOpnd::UnlinkIndexOpnd(this_01);
  if (local_90 == (AddrOpnd *)0x0) {
    iVar3 = IR::IndirOpnd::GetOffset(this_01);
    if (-1 < iVar3) {
      iVar3 = IR::IndirOpnd::GetOffset(this_01);
      bVar2 = Js::TaggedInt::IsOverflow(iVar3);
      if (!bVar2) goto LAB_007c7f0f;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x234b,
                       "(indexOpnd || indir->GetOffset() >= 0 && !Js::TaggedInt::IsOverflow(indir->GetOffset()))"
                       ,
                       "indexOpnd || indir->GetOffset() >= 0 && !Js::TaggedInt::IsOverflow(indir->GetOffset())"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
LAB_007c7f0f:
  if (local_90 == (AddrOpnd *)0x0) {
    iVar3 = IR::IndirOpnd::GetOffset(this_01);
    address = Js::TaggedInt::ToVarUnchecked(iVar3);
    local_90 = IR::AddrOpnd::New(address,AddrOpndKindDynamicVar,func_00,false,(Var)0x0);
  }
  LowererMD::LoadHelperArgument(&this->m_lowererMD,&instr->super_Instr,&local_90->super_Opnd);
  opndArg_00 = IR::IndirOpnd::UnlinkBaseOpnd(this_01);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,&instr->super_Instr,&opndArg_00->super_Opnd);
  IR::Opnd::Free(&this_01->super_Opnd,func_00);
  newSrc = IR::HelperCallOpnd::New(HelperProfiledLdElem,func_00);
  IR::Instr::SetSrc1(&instr->super_Instr,&newSrc->super_Opnd);
  LowererMD::LowerCall(&this->m_lowererMD,&instr->super_Instr,0);
  return;
}

Assistant:

void Lowerer::LowerProfiledLdElemI(IR::JitProfilingInstr *const instr)
{
    Assert(instr);

    /*
        Var ProfilingHelpers::ProfiledLdElem(
            const Var base,
            const Var varIndex,
            FunctionBody *const functionBody,
            const ProfileId profileId,
            bool didArrayAccessHelperCall,
            bool bailedOutOnArraySpecialization)
    */

    Func *const func = instr->m_func;

    m_lowererMD.LoadHelperArgument(instr, IR::IntConstOpnd::New(false, TyInt8, func));
    m_lowererMD.LoadHelperArgument(instr, IR::IntConstOpnd::New(false, TyInt8, func));
    m_lowererMD.LoadHelperArgument(instr, IR::Opnd::CreateProfileIdOpnd(instr->profileId, func));
    m_lowererMD.LoadHelperArgument(instr, CreateFunctionBodyOpnd(func));
    IR::IndirOpnd *const indir = instr->UnlinkSrc1()->AsIndirOpnd();
    IR::Opnd *const indexOpnd = indir->UnlinkIndexOpnd();
    Assert(indexOpnd || indir->GetOffset() >= 0 && !Js::TaggedInt::IsOverflow(indir->GetOffset()));
    m_lowererMD.LoadHelperArgument(
        instr,
        indexOpnd
            ? static_cast<IR::Opnd *>(indexOpnd)
            : IR::AddrOpnd::New(Js::TaggedInt::ToVarUnchecked(indir->GetOffset()), IR::AddrOpndKindDynamicVar, func));
    m_lowererMD.LoadHelperArgument(instr, indir->UnlinkBaseOpnd());
    indir->Free(func);

    instr->SetSrc1(IR::HelperCallOpnd::New(IR::HelperProfiledLdElem, func));
    m_lowererMD.LowerCall(instr, 0);
}